

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O0

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseString<0u,rapidjson::BasicIStreamWrapper<std::istream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler,bool isKey)

{
  Ch CVar1;
  bool bVar2;
  SizeType length_00;
  size_t sVar3;
  Ch *str_00;
  bool local_69;
  Ch *str;
  undefined1 local_50 [4];
  SizeType length;
  StackStream<char> stackStream;
  bool success;
  BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *s;
  StreamLocalCopy<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_0>
  copy;
  bool isKey_local;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *handler_local;
  BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *is_local;
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this_local;
  
  copy.s._7_1_ = isKey;
  internal::
  StreamLocalCopy<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_0>
  ::StreamLocalCopy((StreamLocalCopy<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_0>
                     *)&s,is);
  CVar1 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Peek(s);
  if (CVar1 != '\"') {
    __assert_fail("s.Peek() == \'\\\"\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/reader.h"
                  ,0x3c3,
                  "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseString(InputStream &, Handler &, bool) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::BasicIStreamWrapper<std::basic_istream<char>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                 );
  }
  BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take(s);
  stackStream._15_1_ = 0;
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
  StackStream<char>::StackStream
            ((StackStream<char> *)local_50,(Stack<rapidjson::CrtAllocator> *)this);
  ParseStringToStream<0u,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::BasicIStreamWrapper<std::istream>,rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::StackStream<char>>
            (this,s,(StackStream<char> *)local_50);
  bVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
          HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                         *)this);
  if (!bVar2) {
    sVar3 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
            StackStream<char>::Length((StackStream<char> *)local_50);
    length_00 = (int)sVar3 - 1;
    str_00 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
             StackStream<char>::Pop((StackStream<char> *)local_50);
    if ((copy.s._7_1_ & 1) == 0) {
      local_69 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                 ::String(handler,str_00,length_00,true);
    }
    else {
      local_69 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                 ::Key(handler,str_00,length_00,true);
    }
    stackStream._15_1_ = local_69;
    if (((local_69 ^ 0xffU) & 1) != 0) {
      bVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                             *)this);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/reader.h"
                      ,0x3d9,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseString(InputStream &, Handler &, bool) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::BasicIStreamWrapper<std::basic_istream<char>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      sVar3 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Tell(s);
      GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
      SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                     *)this,kParseErrorTermination,sVar3);
      GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
      HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                     *)this);
    }
  }
  return;
}

Assistant:

void ParseString(InputStream& is, Handler& handler, bool isKey = false) {
        internal::StreamLocalCopy<InputStream> copy(is);
        InputStream& s(copy.s);

        RAPIDJSON_ASSERT(s.Peek() == '\"');
        s.Take();  // Skip '\"'

        bool success = false;
        if (parseFlags & kParseInsituFlag) {
            typename InputStream::Ch *head = s.PutBegin();
            ParseStringToStream<parseFlags, SourceEncoding, SourceEncoding>(s, s);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;
            size_t length = s.PutEnd(head) - 1;
            RAPIDJSON_ASSERT(length <= 0xFFFFFFFF);
            const typename TargetEncoding::Ch* const str = reinterpret_cast<typename TargetEncoding::Ch*>(head);
            success = (isKey ? handler.Key(str, SizeType(length), false) : handler.String(str, SizeType(length), false));
        }
        else {
            StackStream<typename TargetEncoding::Ch> stackStream(stack_);
            ParseStringToStream<parseFlags, SourceEncoding, TargetEncoding>(s, stackStream);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;
            SizeType length = static_cast<SizeType>(stackStream.Length()) - 1;
            const typename TargetEncoding::Ch* const str = stackStream.Pop();
            success = (isKey ? handler.Key(str, length, true) : handler.String(str, length, true));
        }
        if (RAPIDJSON_UNLIKELY(!success))
            RAPIDJSON_PARSE_ERROR(kParseErrorTermination, s.Tell());
    }